

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CborMap::Put(Error *__return_storage_ptr__,CborMap *this,int aKey,int aValue)

{
  _Bool _Var1;
  cn_cbor *cb_value;
  char *begin;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string sStack_78;
  format_string_checker<char> local_58;
  
  cb_value = cn_cbor_int_create((long)aValue,(cn_cbor_errback *)0x0);
  if ((cb_value != (cn_cbor *)0x0) &&
     (_Var1 = cn_cbor_mapput_int((this->super_CborValue).mCbor,(long)aKey,cb_value,
                                 (cn_cbor_errback *)0x0), _Var1)) {
    __return_storage_ptr__->mCode = kNone;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_string_length = 0;
    (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  local_58.types_[0] = none_type;
  local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
       "CBOR map insert integer";
  local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x17;
  local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
  local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
  local_58.parse_funcs_[0] = (parse_func)0x0;
  pcVar2 = "CBOR map insert integer";
  local_58.context_.types_ = local_58.types_;
  while( true ) {
    while( true ) {
      begin = pcVar2;
      if (begin == "") {
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_58;
        ::fmt::v10::vformat_abi_cxx11_
                  (&sStack_78,(v10 *)"CBOR map insert integer",(string_view)ZEXT816(0x17),args);
        __return_storage_ptr__->mCode = kOutOfMemory;
        std::__cxx11::string::string
                  ((string *)&__return_storage_ptr__->mMessage,(string *)&sStack_78);
        std::__cxx11::string::~string((string *)&sStack_78);
        return __return_storage_ptr__;
      }
      pcVar2 = begin + 1;
      if (*begin == '}') break;
      if (*begin == '{') {
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",&local_58);
      }
    }
    if ((pcVar2 == "") || (*pcVar2 != '}')) break;
    pcVar2 = begin + 2;
  }
  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
}

Assistant:

Error CborMap::Put(int aKey, int aValue)
{
    cn_cbor *cborInt = cn_cbor_int_create(aValue, nullptr);
    bool     succeed = cborInt && cn_cbor_mapput_int(mCbor, aKey, cborInt, nullptr);
    return succeed ? ERROR_NONE : ERROR_OUT_OF_MEMORY("CBOR map insert integer");
}